

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

uint __thiscall
PFunction::AddVariant
          (PFunction *this,PPrototype *proto,TArray<unsigned_int,_unsigned_int> *argflags,
          VMFunction *impl)

{
  uint uVar1;
  Variant variant;
  Variant local_40;
  
  local_40.ArgFlags.Array = (uint *)0x0;
  local_40.ArgFlags.Most = 0;
  local_40.ArgFlags.Count = 0;
  TArray<unsigned_int,_unsigned_int>::operator=(&local_40.ArgFlags,argflags);
  impl->Proto = proto;
  local_40.Implementation = impl;
  uVar1 = TArray<PFunction::Variant,_PFunction::Variant>::Push(&this->Variants,&local_40);
  TArray<unsigned_int,_unsigned_int>::~TArray(&local_40.ArgFlags);
  return uVar1;
}

Assistant:

unsigned PFunction::AddVariant(PPrototype *proto, TArray<DWORD> &argflags, VMFunction *impl)
{
	Variant variant;

	//variant.Proto = proto;
	variant.ArgFlags = argflags;
	variant.Implementation = impl;
	impl->Proto = proto;
	return Variants.Push(variant);
}